

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O3

void ihevc_inter_pred_chroma_horz_w16out_ssse3
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  WORD16 *pWVar1;
  bool bVar2;
  int iVar3;
  WORD16 *pWVar4;
  WORD32 WVar5;
  UWORD8 *pUVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  auVar13 = _DAT_001736c0;
  auVar12 = _DAT_001736b0;
  auVar11 = _DAT_00173690;
  iVar3 = src_strd * 2;
  if ((wd & 1U) != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x1150,
                  "void ihevc_inter_pred_chroma_horz_w16out_ssse3(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)pi1_coeff;
  auVar9 = pshuflw(in_XMM1,auVar8,0);
  auVar9._4_4_ = auVar9._0_4_;
  auVar9._8_4_ = auVar9._0_4_;
  auVar9._12_4_ = auVar9._0_4_;
  auVar8 = pshufb(auVar8,_DAT_00173680);
  if ((wd & 2U) == 0) {
    if (1 < ht) {
      pWVar4 = pi2_dst + dst_strd;
      pUVar6 = pu1_src + (long)src_strd + -2;
      WVar5 = ht;
      do {
        if (0 < wd) {
          lVar7 = 0;
          do {
            auVar11 = *(undefined1 (*) [16])(pUVar6 + lVar7);
            auVar14 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar7 + -2),auVar12);
            auVar10 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar7 + -2),auVar13);
            auVar14 = pmaddubsw(auVar14,auVar9);
            auVar10 = pmaddubsw(auVar10,auVar8);
            pWVar1 = pi2_dst + lVar7;
            *pWVar1 = auVar10._0_2_ + auVar14._0_2_;
            pWVar1[1] = auVar10._2_2_ + auVar14._2_2_;
            pWVar1[2] = auVar10._4_2_ + auVar14._4_2_;
            pWVar1[3] = auVar10._6_2_ + auVar14._6_2_;
            pWVar1[4] = auVar10._8_2_ + auVar14._8_2_;
            pWVar1[5] = auVar10._10_2_ + auVar14._10_2_;
            pWVar1[6] = auVar10._12_2_ + auVar14._12_2_;
            pWVar1[7] = auVar10._14_2_ + auVar14._14_2_;
            auVar10 = pshufb(auVar11,auVar12);
            auVar14 = pshufb(auVar11,auVar13);
            auVar11 = pmaddubsw(auVar10,auVar9);
            auVar10 = pmaddubsw(auVar14,auVar8);
            pWVar1 = pWVar4 + lVar7;
            *pWVar1 = auVar10._0_2_ + auVar11._0_2_;
            pWVar1[1] = auVar10._2_2_ + auVar11._2_2_;
            pWVar1[2] = auVar10._4_2_ + auVar11._4_2_;
            pWVar1[3] = auVar10._6_2_ + auVar11._6_2_;
            pWVar1[4] = auVar10._8_2_ + auVar11._8_2_;
            pWVar1[5] = auVar10._10_2_ + auVar11._10_2_;
            pWVar1[6] = auVar10._12_2_ + auVar11._12_2_;
            pWVar1[7] = auVar10._14_2_ + auVar11._14_2_;
            lVar7 = lVar7 + 8;
          } while ((int)lVar7 < wd * 2);
        }
        pu1_src = pu1_src + iVar3;
        pi2_dst = pi2_dst + dst_strd * 2;
        ht = WVar5 + -2;
        pWVar4 = pWVar4 + dst_strd * 2;
        pUVar6 = pUVar6 + iVar3;
        bVar2 = 3 < WVar5;
        WVar5 = ht;
      } while (bVar2);
    }
    auVar12 = _DAT_001736c0;
    auVar11 = _DAT_001736b0;
    if ((ht != 0) && (0 < wd)) {
      lVar7 = 0;
      do {
        auVar10 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar7 + -2),auVar11);
        auVar13 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar7 + -2),auVar12);
        auVar10 = pmaddubsw(auVar10,auVar9);
        auVar13 = pmaddubsw(auVar13,auVar8);
        pWVar4 = pi2_dst + lVar7;
        *pWVar4 = auVar13._0_2_ + auVar10._0_2_;
        pWVar4[1] = auVar13._2_2_ + auVar10._2_2_;
        pWVar4[2] = auVar13._4_2_ + auVar10._4_2_;
        pWVar4[3] = auVar13._6_2_ + auVar10._6_2_;
        pWVar4[4] = auVar13._8_2_ + auVar10._8_2_;
        pWVar4[5] = auVar13._10_2_ + auVar10._10_2_;
        pWVar4[6] = auVar13._12_2_ + auVar10._12_2_;
        pWVar4[7] = auVar13._14_2_ + auVar10._14_2_;
        lVar7 = lVar7 + 8;
      } while ((int)lVar7 < wd * 2);
    }
  }
  else {
    if (1 < ht) {
      pWVar4 = pi2_dst + dst_strd;
      pUVar6 = pu1_src + (long)src_strd + -2;
      WVar5 = ht;
      do {
        if (0 < wd) {
          lVar7 = 0;
          do {
            auVar12 = *(undefined1 (*) [16])(pu1_src + lVar7 + -2);
            auVar13 = *(undefined1 (*) [16])(pUVar6 + lVar7);
            auVar10._0_14_ = auVar12._0_14_;
            auVar10[0xe] = auVar12[7];
            auVar10[0xf] = auVar13[7];
            auVar14._14_2_ = auVar10._14_2_;
            auVar14._0_13_ = auVar12._0_13_;
            auVar14[0xd] = auVar13[6];
            auVar20._13_3_ = auVar14._13_3_;
            auVar20._0_12_ = auVar12._0_12_;
            auVar20[0xc] = auVar12[6];
            auVar19._12_4_ = auVar20._12_4_;
            auVar19._0_11_ = auVar12._0_11_;
            auVar19[0xb] = auVar13[5];
            auVar18._11_5_ = auVar19._11_5_;
            auVar18._0_10_ = auVar12._0_10_;
            auVar18[10] = auVar12[5];
            auVar17._10_6_ = auVar18._10_6_;
            auVar17._0_9_ = auVar12._0_9_;
            auVar17[9] = auVar13[4];
            auVar16._9_7_ = auVar17._9_7_;
            auVar16._0_8_ = auVar12._0_8_;
            auVar16[8] = auVar12[4];
            auVar15._8_8_ = auVar16._8_8_;
            auVar15[7] = auVar13[3];
            auVar15[6] = auVar12[3];
            auVar15[5] = auVar13[2];
            auVar15[4] = auVar12[2];
            auVar15[3] = auVar13[1];
            auVar15[2] = auVar12[1];
            auVar15[0] = auVar12[0];
            auVar15[1] = auVar13[0];
            auVar10 = pshufb(auVar15,auVar11);
            auVar10 = pmaddubsw(auVar10,auVar9);
            auVar13 = pshufb(auVar13,ZEXT816(0x907080607050604));
            auVar12 = pshufb(auVar12,ZEXT816(0x907080607050604));
            auVar12._8_8_ = auVar13._0_8_;
            auVar12 = pmaddubsw(auVar12,auVar8);
            pWVar1 = pi2_dst + lVar7;
            *pWVar1 = auVar12._0_2_ + auVar10._0_2_;
            pWVar1[1] = auVar12._2_2_ + auVar10._2_2_;
            pWVar1[2] = auVar12._4_2_ + auVar10._4_2_;
            pWVar1[3] = auVar12._6_2_ + auVar10._6_2_;
            pWVar4[lVar7 + 4] = auVar12._8_2_ + auVar10._8_2_;
            pWVar4[lVar7 + 5] = auVar12._10_2_ + auVar10._10_2_;
            pWVar4[lVar7 + 6] = auVar12._12_2_ + auVar10._12_2_;
            pWVar4[lVar7 + 7] = auVar12._14_2_ + auVar10._14_2_;
            lVar7 = lVar7 + 4;
          } while ((int)lVar7 < wd * 2);
        }
        pu1_src = pu1_src + iVar3;
        pi2_dst = pi2_dst + dst_strd * 2;
        ht = WVar5 + -2;
        pWVar4 = pWVar4 + dst_strd * 2;
        pUVar6 = pUVar6 + iVar3;
        bVar2 = 3 < WVar5;
        WVar5 = ht;
      } while (bVar2);
    }
    if ((ht != 0) && (0 < wd)) {
      lVar7 = 0;
      do {
        auVar12 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar7 + -2),ZEXT816(0x503040203010200));
        auVar11 = pshufb(*(undefined1 (*) [16])(pu1_src + lVar7 + -2),ZEXT816(0x907080607050604));
        auVar12 = pmaddubsw(auVar12,auVar9);
        auVar11 = pmaddubsw(auVar11,auVar8);
        *(ulong *)(pi2_dst + lVar7) =
             CONCAT26(auVar11._6_2_ + auVar12._6_2_,
                      CONCAT24(auVar11._4_2_ + auVar12._4_2_,
                               CONCAT22(auVar11._2_2_ + auVar12._2_2_,auVar11._0_2_ + auVar12._0_2_)
                              ));
        lVar7 = lVar7 + 4;
      } while ((int)lVar7 < wd * 2);
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_horz_w16out_ssse3(UWORD8 *pu1_src,
                                               WORD16 *pi2_dst,
                                               WORD32 src_strd,
                                               WORD32 dst_strd,
                                               WORD8 *pi1_coeff,
                                               WORD32 ht,
                                               WORD32 wd)
{
    WORD32 row, col;

    __m128i coeff0_1_8x16b, coeff2_3_8x16b, control_mask_1_8x16b, control_mask_2_8x16b, all_zero;
    __m128i src_temp1_16x8b, src_temp2_16x8b, src_temp3_16x8b, src_temp4_16x8b, src_temp5_16x8b, src_temp6_16x8b;
    __m128i src_temp11_16x8b, src_temp12_16x8b, src_temp13_16x8b, src_temp14_16x8b, src_temp15_16x8b, src_temp16_16x8b;
    __m128i res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
    __m128i res_temp11_8x16b, res_temp12_8x16b, res_temp13_8x16b;

    PREFETCH((char const *)(pu1_src + (0 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (1 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (2 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (3 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)

    ASSERT(wd % 2 == 0); /* checking assumption*/

/* loading four 8-bit coefficients and convert 8-bit into 16-bit */
    src_temp1_16x8b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    all_zero = _mm_setzero_si128();

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_2_8x16b);  /* pi1_coeff[4] */

/*  outer for loop starts from here */
    if(wd % 2 == 0 && wd % 4 != 0)
    {
        int offset = 0;
        for(row = ht; row >= 2; row -= 2)
        {
            offset = 0;
            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 4)
            {

                /*load 16 pixel values of row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values of row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel of row 0*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 0*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 0*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                /*Derive the source pixels for processing the 2nd pixel of row 1*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 1*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 1*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp1_8x16b = _mm_unpacklo_epi64(src_temp5_16x8b, src_temp15_16x8b);
                res_temp2_8x16b = _mm_unpacklo_epi64(src_temp6_16x8b, src_temp16_16x8b);
                res_temp11_8x16b = _mm_maddubs_epi16(res_temp1_8x16b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(res_temp2_8x16b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                res_temp3_8x16b = _mm_srli_si128(res_temp13_8x16b, 8);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pi2_dst + offset), res_temp13_8x16b); /* pi2_dst[col] = i2_tmp_u  */



                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pi2_dst + dst_strd + offset), res_temp3_8x16b); /* pi2_dst[col] = i2_tmp_u  */


                offset += 4; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pi2_dst += 2 * dst_strd; /*pointer update*/
        }

        /*Epilogue to handle ht= odd case*/
        if(row)
        {
            offset = 0;
            for(col = 0; col < 2 * wd; col += 4)
            {

                /*load 16 pixel values of row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel of row 0*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 0*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 0*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                res_temp1_8x16b = _mm_unpacklo_epi64(src_temp5_16x8b, all_zero);
                res_temp2_8x16b = _mm_unpacklo_epi64(src_temp6_16x8b, all_zero);
                res_temp11_8x16b = _mm_maddubs_epi16(res_temp1_8x16b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(res_temp2_8x16b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                //res_temp3_8x16b = _mm_srli_si128 (res_temp13_8x16b, 8);

                /* store 4 16-bit values */
                _mm_storel_epi64((__m128i *)(pi2_dst + offset), res_temp13_8x16b); /* pi2_dst[col] = i2_tmp_u  */

                offset += 4; /* To pointer update*/

            }
        }

    }
    else
    {
        int offset = 0;

        for(row = ht; row >= 2; row -= 2)
        {
            offset = 0;
            PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
            PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


            for(col = 0; col < 2 * wd; col += 8)
            {

                /*load 16 pixel values of row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*load 16 pixel values of row 1*/
                src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + src_strd + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel of row 0*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 0*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 0*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                res_temp1_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff0_1_8x16b);
                res_temp2_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp3_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);

                /* store 8 16-bit values */
                _mm_storeu_si128((__m128i *)(pi2_dst + offset), res_temp3_8x16b); /* pi2_dst[col] = i2_tmp_u  */

                /*Derive the source pixels for processing the 2nd pixel of row 1*/
                src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);

                src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 1*/
                src_temp13_16x8b = _mm_srli_si128(src_temp11_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 1*/
                src_temp14_16x8b = _mm_srli_si128(src_temp11_16x8b, 6);

                src_temp16_16x8b = _mm_unpacklo_epi8(src_temp13_16x8b, src_temp14_16x8b);

                res_temp11_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff0_1_8x16b);
                res_temp12_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp13_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);

                /* store 8 16-bit values */
                _mm_storeu_si128((__m128i *)(pi2_dst + dst_strd + offset), res_temp13_8x16b); /* pi2_dst[col] = i2_tmp_u  */


                offset += 8; /* To pointer update*/

            } /* inner loop ends here(8- output values in single iteration)*/

            pu1_src += 2 * src_strd; /*pointer update*/
            pi2_dst += 2 * dst_strd; /*pointer update*/
        }

        /*Epilogue to take care of odd ht*/
        if(row)
        {
            offset = 0;
            for(col = 0; col < 2 * wd; col += 8)
            {

                /*load 16 pixel values of row 0*/
                src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 2 + offset)); /* pu1_src[col + (i-1) * 2]*/

                /*Derive the source pixels for processing the 2nd pixel of row 0*/
                src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);

                src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b);

                /*Derive the source pixels for processing the 3rd pixel of row 0*/
                src_temp3_16x8b = _mm_srli_si128(src_temp1_16x8b, 4);

                /*Derive the source pixels for processing the 4th pixel of row 0*/
                src_temp4_16x8b = _mm_srli_si128(src_temp1_16x8b, 6);

                src_temp6_16x8b = _mm_unpacklo_epi8(src_temp3_16x8b, src_temp4_16x8b);

                res_temp1_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff0_1_8x16b);
                res_temp2_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff2_3_8x16b);

                /* i4_tmp += pi1_coeff[i] * pi2_src[col + (i-1) * 2] */
                res_temp3_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);

                /* store 8 16-bit values */
                _mm_storeu_si128((__m128i *)(pi2_dst + offset), res_temp3_8x16b); /* pi2_dst[col] = i2_tmp_u  */

                offset += 8; /* To pointer update*/

            }
        }

    }
}